

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O3

string * __thiscall
LinkedObjectFile::get_goal_string_abi_cxx11_
          (string *__return_storage_ptr__,LinkedObjectFile *this,int seg,int word_idx)

{
  pointer pvVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  char cword [4];
  string result;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\"","");
  pvVar1 = (this->words_by_seg).
           super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = *(long *)&pvVar1[seg].super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>._M_impl.
                    super__Vector_impl_data;
  uVar3 = ((long)*(pointer *)
                  ((long)&pvVar1[seg].super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                          _M_impl.super__Vector_impl_data + 8) - lVar6 >> 4) * -0x5555555555555555;
  if (word_idx + 1 < (int)uVar3) {
    uVar4 = (ulong)(word_idx + 1);
    if (uVar3 < uVar4 || uVar3 - uVar4 == 0) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    if (*(int *)(lVar6 + uVar4 * 0x30) == 0) {
      lVar6 = lVar6 + uVar4 * 0x30;
      if (*(int *)(lVar6 + 4) != 0) {
        uVar3 = 0;
        do {
          pvVar1 = (this->words_by_seg).
                   super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar5 = (ulong)((int)(uVar3 >> 2) + word_idx + 2);
          lVar2 = *(long *)&pvVar1[seg].super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                            _M_impl.super__Vector_impl_data;
          uVar4 = ((long)*(pointer *)
                          ((long)&pvVar1[seg].
                                  super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                                  _M_impl.super__Vector_impl_data + 8) - lVar2 >> 4) *
                  -0x5555555555555555;
          if (uVar4 < uVar5 || uVar4 - uVar5 == 0) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          }
          if (*(int *)(lVar2 + uVar5 * 0x30) != 0) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)__return_storage_ptr__,"invalid string! (check me!)\n","");
            goto LAB_0012fe42;
          }
          std::__cxx11::string::push_back((char)&local_50);
          uVar3 = uVar3 + 1;
        } while (uVar3 < *(uint *)(lVar6 + 4));
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_50,local_48 + (long)local_50);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,"invalid string!\n","");
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"invalid string!\n","");
  }
LAB_0012fe42:
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LinkedObjectFile::get_goal_string(int seg, int word_idx) {
  std::string result = "\"";
  // next should be the size
  if (word_idx + 1 >= int(words_by_seg[seg].size())) {
    return "invalid string!\n";
  }
  LinkedWord& size_word = words_by_seg[seg].at(word_idx + 1);
  if (size_word.kind != LinkedWord::PLAIN_DATA) {
    // sometimes an array of string pointer triggers this!
    return "invalid string!\n";
  }

  //  result += "(size " + std::to_string(size_word.data) + "): ";
  // now characters...
  for (size_t i = 0; i < size_word.data; i++) {
    int word_offset = word_idx + 2 + (i / 4);
    int byte_offset = i % 4;
    auto& word = words_by_seg[seg].at(word_offset);
    if (word.kind != LinkedWord::PLAIN_DATA) {
      return "invalid string! (check me!)\n";
    }
    char cword[4];
    memcpy(cword, &word.data, 4);
    result += cword[byte_offset];
  }
  return result + "\"";
}